

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall
luna::String::GetStdString_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  uint uVar1;
  char *pcVar2;
  anon_union_16_2_eed97686_for_String_2 *paVar3;
  
  if ((this->super_GCObject).field_0x11 == '\0') {
    uVar1 = this->length_;
    paVar3 = &this->field_1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (char *)((ulong)uVar1 + (long)paVar3);
  }
  else {
    paVar3 = (anon_union_16_2_eed97686_for_String_2 *)(this->field_1).str_;
    uVar1 = this->length_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (char *)((ulong)uVar1 + (long)paVar3);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,paVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string String::GetStdString() const
    {
        if (in_heap_)
            return std::string(str_, length_);
        else
            return std::string(str_buffer_, length_);
    }